

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::ImageButton(Texture *texture,int framePadding,Color *bgColor,Color *tintColor)

{
  bool bVar1;
  Vector2u local_38;
  Vector2<float> local_30;
  Color *local_28;
  Color *tintColor_local;
  Color *bgColor_local;
  Texture *pTStack_10;
  int framePadding_local;
  Texture *texture_local;
  
  local_28 = tintColor;
  tintColor_local = bgColor;
  bgColor_local._4_4_ = framePadding;
  pTStack_10 = texture;
  local_38 = sf::Texture::getSize(texture);
  sf::Vector2<float>::Vector2<unsigned_int>(&local_30,&local_38);
  bVar1 = ImageButton(texture,&local_30,bgColor_local._4_4_,tintColor_local,local_28);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::Texture& texture, const int framePadding, const sf::Color& bgColor,
                 const sf::Color& tintColor) {
    return ImageButton(texture, static_cast<sf::Vector2f>(texture.getSize()), framePadding, bgColor,
                       tintColor);
}